

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3_cancel_auto_extension(_func_void *xInit)

{
  ulong uVar1;
  long lVar2;
  sqlite3_mutex *psVar3;
  int iVar4;
  ulong uVar5;
  
  if (sqlite3Config.bCoreMutex == 0) {
    psVar3 = (sqlite3_mutex *)0x0;
  }
  else {
    psVar3 = (*sqlite3Config.mutex.xMutexAlloc)(2);
  }
  if (psVar3 != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexEnter)(psVar3);
  }
  uVar5 = (ulong)sqlite3Autoext_0;
  do {
    if ((int)uVar5 < 1) {
      iVar4 = 0;
      goto LAB_001f6a96;
    }
    uVar1 = uVar5 - 1;
    lVar2 = uVar5 * 8;
    uVar5 = uVar1;
  } while (*(_func_void **)(sqlite3Autoext_1 + -8 + lVar2) != xInit);
  sqlite3Autoext_0 = sqlite3Autoext_0 - 1;
  *(undefined8 *)(sqlite3Autoext_1 + uVar1 * 8) =
       *(undefined8 *)(sqlite3Autoext_1 + (ulong)sqlite3Autoext_0 * 8);
  iVar4 = 1;
LAB_001f6a96:
  if (psVar3 != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexLeave)(psVar3);
  }
  return iVar4;
}

Assistant:

SQLITE_API int sqlite3_cancel_auto_extension(
  void (*xInit)(void)
){
#if SQLITE_THREADSAFE
  sqlite3_mutex *mutex = sqlite3MutexAlloc(SQLITE_MUTEX_STATIC_MASTER);
#endif
  int i;
  int n = 0;
  wsdAutoextInit;
  sqlite3_mutex_enter(mutex);
  for(i=(int)wsdAutoext.nExt-1; i>=0; i--){
    if( wsdAutoext.aExt[i]==xInit ){
      wsdAutoext.nExt--;
      wsdAutoext.aExt[i] = wsdAutoext.aExt[wsdAutoext.nExt];
      n++;
      break;
    }
  }
  sqlite3_mutex_leave(mutex);
  return n;
}